

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void linearize_expr_list(Proc *proc,AstNodeList *expr_list,Instruction *insn,
                        PseudoList **pseudo_list)

{
  Pseudo *local_58;
  Pseudo *pseudo;
  PtrListIterator expriter__;
  AstNode *pAStack_30;
  int ne;
  AstNode *expr;
  PseudoList **pseudo_list_local;
  Instruction *insn_local;
  AstNodeList *expr_list_local;
  Proc *proc_local;
  
  expriter__._20_4_ = raviX_ptrlist_size((PtrList *)expr_list);
  raviX_ptrlist_forward_iterator((PtrListIterator *)&pseudo,(PtrList *)expr_list);
  pAStack_30 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)&pseudo);
  while (pAStack_30 != (AstNode *)0x0) {
    expriter__._20_4_ = expriter__._20_4_ + -1;
    local_58 = linearize_expression(proc,pAStack_30);
    if ((expriter__._20_4_ == 0) ||
       (((undefined1  [48])*local_58 & (undefined1  [48])0xf) != (undefined1  [48])0xb)) {
      if (((undefined1  [48])*local_58 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
        local_58 = indexed_load(proc,local_58);
      }
    }
    else {
      convert_range_to_temp(local_58);
    }
    raviX_ptrlist_add((PtrList **)pseudo_list,local_58,proc->linearizer->compiler_state->allocator);
    pAStack_30 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)&pseudo);
  }
  return;
}

Assistant:

static void linearize_expr_list(Proc *proc, AstNodeList *expr_list, Instruction *insn,
				PseudoList **pseudo_list)
{
	AstNode *expr;
	int ne = raviX_ptrlist_size((const PtrList *)expr_list);
	FOR_EACH_PTR(expr_list, AstNode, expr)
	{
		ne -= 1;
		Pseudo *pseudo = linearize_expression(proc, expr);
		if (ne != 0 && pseudo->type == PSEUDO_RANGE) {
			convert_range_to_temp(pseudo); // Only accept one result unless it is the last expr
		}
		else if (pseudo->type == PSEUDO_INDEXED) {
			pseudo = indexed_load(proc, pseudo);
		}
		raviX_ptrlist_add((PtrList **)pseudo_list, pseudo, proc->linearizer->compiler_state->allocator);
	}
	END_FOR_EACH_PTR(expr)
}